

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_json.c
# Opt level: O0

_Bool JSON_parse(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value_00;
  gravity_value_t value_01;
  json_value *json_00;
  gravity_value_t gVar1;
  json_value *json;
  gravity_string_t *string;
  gravity_value_t value;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  if (nargs < 2) {
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,rindex);
  }
  else if (args[1].isa == gravity_class_string) {
    json_00 = json_parse((char *)(args[1].field_1.p)->objclass,
                         (ulong)*(uint *)((long)&(args[1].field_1.p)->identifier + 4));
    if (json_00 == (json_value *)0x0) {
      gVar1.field_1.n = 0;
      gVar1.isa = gravity_class_null;
      gravity_vm_setslot(vm,gVar1,rindex);
    }
    else {
      gVar1 = JSON_value(vm,json_00);
      gravity_vm_setslot(vm,gVar1,rindex);
    }
  }
  else {
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,rindex);
  }
  return true;
}

Assistant:

static bool JSON_parse (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_VALUE(VALUE_FROM_NULL, rindex);
    
    // value to parse
    gravity_value_t value = GET_VALUE(1);
    if (!VALUE_ISA_STRING(value)) RETURN_VALUE(VALUE_FROM_NULL, rindex);
    
    gravity_string_t *string = VALUE_AS_STRING(value);
    json_value *json = json_parse(string->s, string->len);
    if (!json) RETURN_VALUE(VALUE_FROM_NULL, rindex);
    
    RETURN_VALUE(JSON_value(vm, json), rindex);
}